

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O0

void __thiscall
gtl::
dense_hashtable<unsigned_int,_unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_gtl::dense_hash_set<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>::Identity,_gtl::dense_hash_set<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>::SetKey,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>
::rebucket(dense_hashtable<unsigned_int,_unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_gtl::dense_hash_set<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>::Identity,_gtl::dense_hash_set<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>::SetKey,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>
           *this,size_type new_num_buckets)

{
  move_iterator<gtl::dense_hashtable_iterator<unsigned_int,_unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_gtl::dense_hash_set<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>::Identity,_gtl::dense_hash_set<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>::SetKey,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>_>
  src_first;
  dense_hashtable_iterator<unsigned_int,_unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_gtl::dense_hash_set<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>::Identity,_gtl::dense_hash_set<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>::SetKey,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>
  __i;
  dense_hashtable_iterator<unsigned_int,_unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_gtl::dense_hash_set<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>::Identity,_gtl::dense_hash_set<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>::SetKey,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>
  __i_00;
  move_iterator<gtl::dense_hashtable_iterator<unsigned_int,_unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_gtl::dense_hash_set<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>::Identity,_gtl::dense_hash_set<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>::SetKey,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>_>
  src_last;
  bool bVar1;
  value_alloc_type *pvVar2;
  size_type num_buckets;
  float fVar3;
  pointer in_stack_ffffffffffffff50;
  iterator local_80;
  undefined8 local_68;
  undefined8 local_60;
  pointer local_58;
  iterator local_50;
  undefined8 local_38;
  undefined8 local_30;
  pointer local_28;
  uint *local_20;
  pointer new_table;
  size_type new_num_buckets_local;
  dense_hashtable<unsigned_int,_unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_gtl::dense_hash_set<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>::Identity,_gtl::dense_hash_set<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>::SetKey,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>
  *this_local;
  
  if (this->table == (pointer)0x0) {
    this->num_buckets = new_num_buckets;
  }
  else {
    new_table = (pointer)new_num_buckets;
    new_num_buckets_local = (size_type)this;
    bVar1 = sh_hashtable_settings<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_unsigned_long,_4>
            ::use_empty((sh_hashtable_settings<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_unsigned_long,_4>
                         *)this);
    if (!bVar1) {
      __assert_fail("settings.use_empty()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/densehashtable.h"
                    ,0x2d9,
                    "void gtl::dense_hashtable<unsigned int, unsigned int, SequenceLexicon<int>::IdHasher, gtl::dense_hash_set<unsigned int, SequenceLexicon<int>::IdHasher, SequenceLexicon<int>::IdKeyEqual>::Identity, gtl::dense_hash_set<unsigned int, SequenceLexicon<int>::IdHasher, SequenceLexicon<int>::IdKeyEqual>::SetKey, SequenceLexicon<int>::IdKeyEqual, std::allocator<unsigned int>>::rebucket(size_type) [Value = unsigned int, Key = unsigned int, HashFcn = SequenceLexicon<int>::IdHasher, ExtractKey = gtl::dense_hash_set<unsigned int, SequenceLexicon<int>::IdHasher, SequenceLexicon<int>::IdKeyEqual>::Identity, SetKey = gtl::dense_hash_set<unsigned int, SequenceLexicon<int>::IdHasher, SequenceLexicon<int>::IdKeyEqual>::SetKey, EqualKey = SequenceLexicon<int>::IdKeyEqual, Alloc = std::allocator<unsigned int>]"
                   );
    }
    if (((ulong)new_table & (long)new_table - 1U) != 0) {
      __assert_fail("(new_num_buckets & (new_num_buckets - 1)) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/densehashtable.h"
                    ,0x2da,
                    "void gtl::dense_hashtable<unsigned int, unsigned int, SequenceLexicon<int>::IdHasher, gtl::dense_hash_set<unsigned int, SequenceLexicon<int>::IdHasher, SequenceLexicon<int>::IdKeyEqual>::Identity, gtl::dense_hash_set<unsigned int, SequenceLexicon<int>::IdHasher, SequenceLexicon<int>::IdKeyEqual>::SetKey, SequenceLexicon<int>::IdKeyEqual, std::allocator<unsigned int>>::rebucket(size_type) [Value = unsigned int, Key = unsigned int, HashFcn = SequenceLexicon<int>::IdHasher, ExtractKey = gtl::dense_hash_set<unsigned int, SequenceLexicon<int>::IdHasher, SequenceLexicon<int>::IdKeyEqual>::Identity, SetKey = gtl::dense_hash_set<unsigned int, SequenceLexicon<int>::IdHasher, SequenceLexicon<int>::IdKeyEqual>::SetKey, EqualKey = SequenceLexicon<int>::IdKeyEqual, Alloc = std::allocator<unsigned int>]"
                   );
    }
    fVar3 = sh_hashtable_settings<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_unsigned_long,_4>
            ::shrink_factor((sh_hashtable_settings<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_unsigned_long,_4>
                             *)this);
    bVar1 = true;
    if (fVar3 <= 0.0) {
      bVar1 = (pointer)this->num_buckets <= new_table;
    }
    if (!bVar1) {
      __assert_fail("settings.shrink_factor() > 0 || new_num_buckets >= num_buckets",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/densehashtable.h"
                    ,0x2dc,
                    "void gtl::dense_hashtable<unsigned int, unsigned int, SequenceLexicon<int>::IdHasher, gtl::dense_hash_set<unsigned int, SequenceLexicon<int>::IdHasher, SequenceLexicon<int>::IdKeyEqual>::Identity, gtl::dense_hash_set<unsigned int, SequenceLexicon<int>::IdHasher, SequenceLexicon<int>::IdKeyEqual>::SetKey, SequenceLexicon<int>::IdKeyEqual, std::allocator<unsigned int>>::rebucket(size_type) [Value = unsigned int, Key = unsigned int, HashFcn = SequenceLexicon<int>::IdHasher, ExtractKey = gtl::dense_hash_set<unsigned int, SequenceLexicon<int>::IdHasher, SequenceLexicon<int>::IdKeyEqual>::Identity, SetKey = gtl::dense_hash_set<unsigned int, SequenceLexicon<int>::IdHasher, SequenceLexicon<int>::IdKeyEqual>::SetKey, EqualKey = SequenceLexicon<int>::IdKeyEqual, Alloc = std::allocator<unsigned int>]"
                   );
    }
    pvVar2 = get_internal_allocator(this);
    local_20 = __gnu_cxx::new_allocator<unsigned_int>::allocate
                         ((new_allocator<unsigned_int> *)pvVar2,(size_type)new_table,(void *)0x0);
    fill_range_with_empty(this,local_20,local_20 + (long)new_table);
    begin(&local_50,this);
    __i.pos = local_50.end;
    __i.ht = (dense_hashtable<unsigned_int,_unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_gtl::dense_hash_set<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>::Identity,_gtl::dense_hash_set<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>::SetKey,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>
              *)local_50.pos;
    __i.end = in_stack_ffffffffffffff50;
    std::
    make_move_iterator<gtl::dense_hashtable_iterator<unsigned_int,unsigned_int,SequenceLexicon<int,std::hash<int>,std::equal_to<int>>::IdHasher,gtl::dense_hash_set<unsigned_int,SequenceLexicon<int,std::hash<int>,std::equal_to<int>>::IdHasher,SequenceLexicon<int,std::hash<int>,std::equal_to<int>>::IdKeyEqual,std::allocator<unsigned_int>>::Identity,gtl::dense_hash_set<unsigned_int,SequenceLexicon<int,std::hash<int>,std::equal_to<int>>::IdHasher,SequenceLexicon<int,std::hash<int>,std::equal_to<int>>::IdKeyEqual,std::allocator<unsigned_int>>::SetKey,SequenceLexicon<int,std::hash<int>,std::equal_to<int>>::IdKeyEqual,std::allocator<unsigned_int>>>
              (__i);
    end(&local_80,this);
    __i_00.pos = local_80.end;
    __i_00.ht = (dense_hashtable<unsigned_int,_unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_gtl::dense_hash_set<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>::Identity,_gtl::dense_hash_set<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>::SetKey,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>
                 *)local_80.pos;
    __i_00.end = in_stack_ffffffffffffff50;
    std::
    make_move_iterator<gtl::dense_hashtable_iterator<unsigned_int,unsigned_int,SequenceLexicon<int,std::hash<int>,std::equal_to<int>>::IdHasher,gtl::dense_hash_set<unsigned_int,SequenceLexicon<int,std::hash<int>,std::equal_to<int>>::IdHasher,SequenceLexicon<int,std::hash<int>,std::equal_to<int>>::IdKeyEqual,std::allocator<unsigned_int>>::Identity,gtl::dense_hash_set<unsigned_int,SequenceLexicon<int,std::hash<int>,std::equal_to<int>>::IdHasher,SequenceLexicon<int,std::hash<int>,std::equal_to<int>>::IdKeyEqual,std::allocator<unsigned_int>>::SetKey,SequenceLexicon<int,std::hash<int>,std::equal_to<int>>::IdKeyEqual,std::allocator<unsigned_int>>>
              (__i_00);
    src_first._M_current.pos = (pointer)local_30;
    src_first._M_current.ht =
         (dense_hashtable<unsigned_int,_unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_gtl::dense_hash_set<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>::Identity,_gtl::dense_hash_set<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>::SetKey,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>
          *)local_38;
    src_first._M_current.end = local_28;
    src_last._M_current.pos = (pointer)local_60;
    src_last._M_current.ht =
         (dense_hashtable<unsigned_int,_unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_gtl::dense_hash_set<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>::Identity,_gtl::dense_hash_set<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>::SetKey,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdKeyEqual,_std::allocator<unsigned_int>_>
          *)local_68;
    src_last._M_current.end = local_58;
    dense_hashtable<unsigned_int,unsigned_int,SequenceLexicon<int,std::hash<int>,std::equal_to<int>>::IdHasher,gtl::dense_hash_set<unsigned_int,SequenceLexicon<int,std::hash<int>,std::equal_to<int>>::IdHasher,SequenceLexicon<int,std::hash<int>,std::equal_to<int>>::IdKeyEqual,std::allocator<unsigned_int>>::Identity,gtl::dense_hash_set<unsigned_int,SequenceLexicon<int,std::hash<int>,std::equal_to<int>>::IdHasher,SequenceLexicon<int,std::hash<int>,std::equal_to<int>>::IdKeyEqual,std::allocator<unsigned_int>>::SetKey,SequenceLexicon<int,std::hash<int>,std::equal_to<int>>::IdKeyEqual,std::allocator<unsigned_int>>
    ::
    copy_elements<std::move_iterator<gtl::dense_hashtable_iterator<unsigned_int,unsigned_int,SequenceLexicon<int,std::hash<int>,std::equal_to<int>>::IdHasher,gtl::dense_hash_set<unsigned_int,SequenceLexicon<int,std::hash<int>,std::equal_to<int>>::IdHasher,SequenceLexicon<int,std::hash<int>,std::equal_to<int>>::IdKeyEqual,std::allocator<unsigned_int>>::Identity,gtl::dense_hash_set<unsigned_int,SequenceLexicon<int,std::hash<int>,std::equal_to<int>>::IdHasher,SequenceLexicon<int,std::hash<int>,std::equal_to<int>>::IdKeyEqual,std::allocator<unsigned_int>>::SetKey,SequenceLexicon<int,std::hash<int>,std::equal_to<int>>::IdKeyEqual,std::allocator<unsigned_int>>>>
              ((dense_hashtable<unsigned_int,unsigned_int,SequenceLexicon<int,std::hash<int>,std::equal_to<int>>::IdHasher,gtl::dense_hash_set<unsigned_int,SequenceLexicon<int,std::hash<int>,std::equal_to<int>>::IdHasher,SequenceLexicon<int,std::hash<int>,std::equal_to<int>>::IdKeyEqual,std::allocator<unsigned_int>>::Identity,gtl::dense_hash_set<unsigned_int,SequenceLexicon<int,std::hash<int>,std::equal_to<int>>::IdHasher,SequenceLexicon<int,std::hash<int>,std::equal_to<int>>::IdKeyEqual,std::allocator<unsigned_int>>::SetKey,SequenceLexicon<int,std::hash<int>,std::equal_to<int>>::IdKeyEqual,std::allocator<unsigned_int>>
                *)this,src_first,src_last,local_20,(size_type)new_table);
    destroy_buckets(this,0,this->num_buckets);
    pvVar2 = get_internal_allocator(this);
    __gnu_cxx::new_allocator<unsigned_int>::deallocate
              ((new_allocator<unsigned_int> *)pvVar2,this->table,this->num_buckets);
    this->table = local_20;
    this->num_buckets = (size_type)new_table;
    if (this->num_elements < this->num_deleted) {
      __assert_fail("num_elements >= num_deleted",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/util/gtl/densehashtable.h"
                    ,0x2e9,
                    "void gtl::dense_hashtable<unsigned int, unsigned int, SequenceLexicon<int>::IdHasher, gtl::dense_hash_set<unsigned int, SequenceLexicon<int>::IdHasher, SequenceLexicon<int>::IdKeyEqual>::Identity, gtl::dense_hash_set<unsigned int, SequenceLexicon<int>::IdHasher, SequenceLexicon<int>::IdKeyEqual>::SetKey, SequenceLexicon<int>::IdKeyEqual, std::allocator<unsigned int>>::rebucket(size_type) [Value = unsigned int, Key = unsigned int, HashFcn = SequenceLexicon<int>::IdHasher, ExtractKey = gtl::dense_hash_set<unsigned int, SequenceLexicon<int>::IdHasher, SequenceLexicon<int>::IdKeyEqual>::Identity, SetKey = gtl::dense_hash_set<unsigned int, SequenceLexicon<int>::IdHasher, SequenceLexicon<int>::IdKeyEqual>::SetKey, EqualKey = SequenceLexicon<int>::IdKeyEqual, Alloc = std::allocator<unsigned int>]"
                   );
    }
    this->num_elements = this->num_elements - this->num_deleted;
    this->num_deleted = 0;
    num_buckets = bucket_count(this);
    sh_hashtable_settings<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_unsigned_long,_4>
    ::reset_thresholds((sh_hashtable_settings<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_unsigned_long,_4>
                        *)this,num_buckets);
    sh_hashtable_settings<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_unsigned_long,_4>
    ::inc_num_ht_copies((sh_hashtable_settings<unsigned_int,_SequenceLexicon<int,_std::hash<int>,_std::equal_to<int>_>::IdHasher,_unsigned_long,_4>
                         *)this);
  }
  return;
}

Assistant:

void rebucket(size_type new_num_buckets) {
    if (table == nullptr) {
      // When we eventually allocate the table, it will have this many buckets.
      num_buckets = new_num_buckets;
      return;
    }
    assert(settings.use_empty());
    assert((new_num_buckets & (new_num_buckets - 1)) == 0);  // a power of two
    // If settings.shrink_factor() is zero then we must not shrink.
    assert(settings.shrink_factor() > 0 || new_num_buckets >= num_buckets);
    pointer new_table = get_internal_allocator().allocate(new_num_buckets);

    fill_range_with_empty(new_table, new_table + new_num_buckets);
    copy_elements(std::make_move_iterator(begin()),
                  std::make_move_iterator(end()),
                  new_table, new_num_buckets);

    destroy_buckets(0, num_buckets);  // Destroy table's elements.
    get_internal_allocator().deallocate(table, num_buckets);

    table = new_table;
    num_buckets = new_num_buckets;
    assert(num_elements >= num_deleted);
    num_elements -= num_deleted;
    num_deleted = 0;
    settings.reset_thresholds(bucket_count());
    settings.inc_num_ht_copies();
  }